

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  shared;
  BuildParameters supermapParams;
  CommandLineInterface cli;
  undefined1 local_169;
  element_type *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_160;
  string local_158;
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  local_138;
  undefined1 local_128 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  shared_ptr<supermap::cli::CommandLineInterface::Handler> local_118;
  shared_ptr<supermap::cli::CommandLineInterface::Handler> local_108;
  shared_ptr<supermap::cli::CommandLineInterface::Handler> local_f8;
  shared_ptr<supermap::cli::CommandLineInterface::Handler> local_e8;
  string local_d0;
  undefined1 local_b0 [16];
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  double local_80;
  CommandLineInterface local_78;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"supermap","");
  supermap::cli::CommandLineInterface::CommandLineInterface(&local_78,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_b0._0_8_ = 3;
  local_b0._8_8_ = 0.5;
  local_a0._M_p = (pointer)&local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"supermap","");
  local_80 = 0.03125;
  local_158._M_dataplus._M_p = (pointer)operator_new(0x40);
  *(long *)((long)local_158._M_dataplus._M_p + 0x10) = 0;
  *(long *)((long)local_158._M_dataplus._M_p + 0x18) = 0;
  *(undefined ***)local_158._M_dataplus._M_p = &PTR_add_001287c0;
  *(undefined **)((long)local_158._M_dataplus._M_p + 8) = &DAT_00128810;
  *(long *)((long)local_158._M_dataplus._M_p + 0x20) = 0;
  *(long **)((long)local_158._M_dataplus._M_p + 0x28) =
       (long *)((long)local_158._M_dataplus._M_p + 0x18);
  *(long **)((long)local_158._M_dataplus._M_p + 0x30) =
       (long *)((long)local_158._M_dataplus._M_p + 0x18);
  *(long *)((long)local_158._M_dataplus._M_p + 0x38) = 0;
  supermap::
  DefaultSupermap<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
  ::build((DefaultSupermap<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
           *)&local_120,
          (unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>_>_>
           *)&local_158,(BuildParameters *)local_b0);
  if ((long *)local_158._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_158._M_dataplus._M_p + 0x28))();
  }
  local_158._M_string_length = (size_type)&local_138;
  local_138.
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)&PTR_build_00127990;
  local_138.
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_120;
  local_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_158._M_dataplus._M_p = (pointer)&PTR_build_001279d0;
  supermap::detail::RemovableBuilder<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::
  build((RemovableBuilder<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> *)local_128);
  local_138.
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)&PTR_build_00127990;
  if (local_138.
      super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(local_138.
       super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_vptr__Sp_counted_base[5])();
  }
  local_138.
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_128;
  local_128 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>*>
            (&local_138.
              super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_138.
             super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  paVar1 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"add","");
  local_168 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<supermap::cli::AddKeyHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,std::allocator<supermap::cli::AddKeyHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>>,std::shared_ptr<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>>&>
            (&_Stack_160,
             (AddKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> **)
             &local_168,
             (allocator<supermap::cli::AddKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
              *)&local_169,&local_138);
  local_e8.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_168;
  local_e8.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_160._M_pi;
  local_168 = (element_type *)0x0;
  _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  supermap::cli::CommandLineInterface::addCommand(&local_78,&local_158,&local_e8);
  if (local_e8.
      super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.
               super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_160._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"remove","");
  local_168 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<supermap::cli::RemoveKeyHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,std::allocator<supermap::cli::RemoveKeyHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>>,std::shared_ptr<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>>&>
            (&_Stack_160,
             (RemoveKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> **)
             &local_168,
             (allocator<supermap::cli::RemoveKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
              *)&local_169,&local_138);
  local_f8.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_168;
  local_f8.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_160._M_pi;
  local_168 = (element_type *)0x0;
  _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  supermap::cli::CommandLineInterface::addCommand(&local_78,&local_158,&local_f8);
  if (local_f8.
      super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.
               super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_160._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"contains","");
  local_168 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<supermap::cli::ContainsKeyHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,std::allocator<supermap::cli::ContainsKeyHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>>,std::shared_ptr<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>>&>
            (&_Stack_160,
             (ContainsKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> **)
             &local_168,
             (allocator<supermap::cli::ContainsKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
              *)&local_169,&local_138);
  local_108.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_168;
  local_108.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_160._M_pi;
  local_168 = (element_type *)0x0;
  _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  supermap::cli::CommandLineInterface::addCommand(&local_78,&local_158,&local_108);
  if (local_108.
      super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.
               super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_160._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"get","");
  local_168 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<supermap::cli::GetValueHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,std::allocator<supermap::cli::GetValueHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>>,std::shared_ptr<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>>&>
            (&_Stack_160,
             (GetValueHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> **)
             &local_168,
             (allocator<supermap::cli::GetValueHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
              *)&local_169,&local_138);
  local_118.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_168;
  local_118.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_160._M_pi;
  local_168 = (element_type *)0x0;
  _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  supermap::cli::CommandLineInterface::addCommand(&local_78,&local_158,&local_118);
  if (local_118.
      super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.
               super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_160._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  supermap::cli::CommandLineInterface::run(&local_78,(istream *)&std::cin,(ostream *)&std::cout);
  if (local_138.
      super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.
               super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_128 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_128 + 0x28))();
  }
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*local_120->_vptr__Sp_counted_base[5])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<supermap::cli::CommandLineInterface::Handler>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<supermap::cli::CommandLineInterface::Handler>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_78.handlers_._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name_._M_dataplus._M_p != &local_78.name_.field_2) {
    operator_delete(local_78.name_._M_dataplus._M_p,local_78.name_.field_2._M_allocated_capacity + 1
                   );
  }
  return 0;
}

Assistant:

int main(int, const char **) {
    supermap::cli::CommandLineInterface cli("supermap");

    using K = supermap::Key<1>;
    using V = supermap::ByteArray<1>;
    using I = std::uint64_t;
    using MaybeV = supermap::MaybeRemovedValue<V>;

    using SupermapBuilder = supermap::DefaultSupermap<K, MaybeV, I>;

    auto supermapParams = SupermapBuilder::BuildParameters{
        3,
        0.5,
        "supermap",
        1 / 32.0
    };

    auto backendKvs = SupermapBuilder::build(
        std::make_unique<supermap::BST<K, I, I>>(),
        supermapParams
    );

    std::unique_ptr<supermap::KeyValueStorage<K, V, I>> kvs =
        supermap::builder::fromKvs<K, MaybeV, I>(std::move(backendKvs))
            .removable()
            .build();

    std::shared_ptr<supermap::KeyValueStorage<K, V, I>>
        shared = std::shared_ptr<supermap::KeyValueStorage<K, V, I>>(kvs.release());

    cli.addCommand("add", std::make_shared<supermap::cli::AddKeyHandler<K, V, I>>(shared));
    cli.addCommand("remove", std::make_shared<supermap::cli::RemoveKeyHandler<K, V, I>>(shared));
    cli.addCommand("contains", std::make_shared<supermap::cli::ContainsKeyHandler<K, V, I>>(shared));
    cli.addCommand("get", std::make_shared<supermap::cli::GetValueHandler<K, V, I>>(shared));

    cli.run(std::cin, std::cout);
}